

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O1

pair<bool,_std::pair<imrt::Station_*,_int>_> * __thiscall
imrt::Plan::getLSBeamlet
          (pair<bool,_std::pair<imrt::Station_*,_int>_> *__return_storage_ptr__,Plan *this,int bsize
          ,int vsize)

{
  _Base_ptr p_Var1;
  int iVar2;
  ulong uVar3;
  set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  sb;
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  _Stack_48;
  
  EvaluationFunction::best_beamlets
            ((set<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
              *)&_Stack_48,this->ev,this,bsize,vsize,0);
  iVar2 = rand();
  uVar3 = (ulong)(long)iVar2 % _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
  if ((long)uVar3 < 1) {
    for (; uVar3 != 0; uVar3 = uVar3 + 1) {
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_decrement(_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left);
    }
  }
  else {
    do {
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  __return_storage_ptr__->first =
       *(bool *)&_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
  p_Var1 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_right;
  (__return_storage_ptr__->second).first =
       (Station *)_Stack_48._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left;
  *(_Base_ptr *)&(__return_storage_ptr__->second).second = p_Var1;
  std::
  _Rb_tree<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>,_std::_Identity<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::greater<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>,_std::allocator<std::pair<std::pair<double,_bool>,_std::pair<imrt::Station_*,_int>_>_>_>
  ::~_Rb_tree(&_Stack_48);
  return __return_storage_ptr__;
}

Assistant:

virtual pair<bool, pair<Station*, int>> getLSBeamlet(int bsize, int vsize){
		  auto sb=ev.best_beamlets(*this, bsize, vsize);
		  auto it=sb.begin();
		  std::advance(it,rand()%sb.size());
		  return make_pair(it->first.second, it->second);
	}